

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O0

void BuilderTests<GrpcLikeMessageBuilder,_GrpcLikeMessageBuilder>::builder_swap_after_finish_test
               (bool run)

{
  Color CVar1;
  bool bVar2;
  Offset<MyGame::Example::Monster> root;
  SizeT SVar3;
  string local_190;
  string local_170;
  SizeT local_14c;
  offset_type local_148;
  SizeT size2;
  undefined1 local_140 [4];
  Offset<MyGame::Example::Monster> root_offset2;
  GrpcLikeMessageBuilder dst;
  SizeT size1;
  undefined1 local_98 [4];
  Offset<MyGame::Example::Monster> root_offset1;
  GrpcLikeMessageBuilder src;
  bool run_local;
  
  if (run) {
    src.super_FlatBufferBuilder.string_pool._7_1_ = run;
    GrpcLikeMessageBuilder::GrpcLikeMessageBuilder((GrpcLikeMessageBuilder *)local_98);
    root = populate1((FlatBufferBuilder *)&src);
    flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
              ((FlatBufferBuilderImpl<false> *)&src,root,(char *)0x0);
    dst.super_FlatBufferBuilder.string_pool._4_4_ =
         flatbuffers::FlatBufferBuilderImpl<false>::GetSize((FlatBufferBuilderImpl<false> *)&src);
    GrpcLikeMessageBuilder::GrpcLikeMessageBuilder((GrpcLikeMessageBuilder *)local_140);
    local_148 = (offset_type)populate2((FlatBufferBuilder *)&dst);
    size2 = local_148;
    flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
              ((FlatBufferBuilderImpl<false> *)&dst,(Offset<MyGame::Example::Monster>)local_148,
               (char *)0x0);
    local_14c = flatbuffers::FlatBufferBuilderImpl<false>::GetSize
                          ((FlatBufferBuilderImpl<false> *)&dst);
    GrpcLikeMessageBuilder::Swap
              ((GrpcLikeMessageBuilder *)local_98,(GrpcLikeMessageBuilder *)local_140);
    SVar3 = flatbuffers::FlatBufferBuilderImpl<false>::GetSize((FlatBufferBuilderImpl<false> *)&src)
    ;
    TestEq<unsigned_int,unsigned_int>
              (SVar3,local_14c,"\'src.GetSize()\' != \'size2\'",
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
               ,0xc5,
               "static void BuilderTests<GrpcLikeMessageBuilder>::builder_swap_after_finish_test(bool) [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
              );
    SVar3 = flatbuffers::FlatBufferBuilderImpl<false>::GetSize((FlatBufferBuilderImpl<false> *)&dst)
    ;
    TestEq<unsigned_int,unsigned_int>
              (SVar3,dst.super_FlatBufferBuilder.string_pool._4_4_,"\'dst.GetSize()\' != \'size1\'",
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
               ,0xc6,
               "static void BuilderTests<GrpcLikeMessageBuilder>::builder_swap_after_finish_test(bool) [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
              );
    m2_name_abi_cxx11_();
    CVar1 = m2_color();
    bVar2 = release_n_verify((FlatBufferBuilder *)&src,&local_170,CVar1);
    TestEq<bool,bool>(true,bVar2,"\'true\' != \'release_n_verify(src, m2_name(), m2_color())\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                      ,199,
                      "static void BuilderTests<GrpcLikeMessageBuilder>::builder_swap_after_finish_test(bool) [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
                     );
    std::__cxx11::string::~string((string *)&local_170);
    m1_name_abi_cxx11_();
    CVar1 = m1_color();
    bVar2 = release_n_verify((FlatBufferBuilder *)&dst,&local_190,CVar1);
    TestEq<bool,bool>(true,bVar2,"\'true\' != \'release_n_verify(dst, m1_name(), m1_color())\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                      ,200,
                      "static void BuilderTests<GrpcLikeMessageBuilder>::builder_swap_after_finish_test(bool) [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
                     );
    std::__cxx11::string::~string((string *)&local_190);
    GrpcLikeMessageBuilder::~GrpcLikeMessageBuilder((GrpcLikeMessageBuilder *)local_140);
    GrpcLikeMessageBuilder::~GrpcLikeMessageBuilder((GrpcLikeMessageBuilder *)local_98);
  }
  return;
}

Assistant:

static void builder_swap_after_finish_test(
      bool run = std::is_same<DestBuilder, SrcBuilder>::value) {
    /// Swap is allowed only when lhs and rhs are the same concrete type.
    if (run) {
      SrcBuilder src;
      auto root_offset1 = populate1(src);
      src.Finish(root_offset1);
      auto size1 = src.GetSize();
      DestBuilder dst;
      auto root_offset2 = populate2(dst);
      dst.Finish(root_offset2);
      auto size2 = dst.GetSize();
      src.Swap(dst);
      TEST_EQ_FUNC(src.GetSize(), size2);
      TEST_EQ_FUNC(dst.GetSize(), size1);
      TEST_ASSERT_FUNC(release_n_verify(src, m2_name(), m2_color()));
      TEST_ASSERT_FUNC(release_n_verify(dst, m1_name(), m1_color()));
    }
  }